

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

void __thiscall
viennamath::rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *this,size_type num)

{
  long lVar1;
  bool bVar2;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> local_38;
  
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_00117568;
  std::
  vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
  ::vector(&this->
            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
           ,num,(allocator_type *)&local_38);
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_vector_expr_00117610;
  lVar1 = 0;
  while (bVar2 = num != 0, num = num - 1, bVar2) {
    local_38.super_rt_expression_interface<double>._vptr_rt_expression_interface =
         (_func_int **)&PTR__rt_expression_interface_001177a8;
    local_38.s = 0.0;
    rt_expr<viennamath::rt_expression_interface<double>>::operator=
              ((rt_expr<viennamath::rt_expression_interface<double>> *)
               ((long)&(((this->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ).
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr + lVar1),
               &local_38);
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

explicit rt_vector_expr(size_type num) : BaseType(num)
      {
        //initialize all zeros:
        for (std::size_t i=0; i<num; ++i)
          BaseType::operator[](i) = viennamath::rt_constant<numeric_type, interface_type>(0);
      }